

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_heap_swap(void)

{
  int iVar1;
  uchar e [600];
  uchar a [600];
  undefined1 auStackY_4b8 [16];
  size_t in_stack_fffffffffffffb58;
  size_t in_stack_fffffffffffffb60;
  size_t in_stack_fffffffffffffb68;
  uchar *in_stack_fffffffffffffb70;
  undefined1 auStack_3f0 [200];
  undefined1 auStack_328 [208];
  undefined1 local_258 [200];
  undefined1 auStack_190 [200];
  undefined1 auStack_c8 [200];
  
  memset(local_258,0x15,200);
  memset(auStack_190,99,200);
  memset(auStack_c8,0x2a,200);
  memset(auStackY_4b8,0x2a,200);
  memset(auStack_3f0,99,200);
  memset(auStack_328,0x15,200);
  secp256k1_heap_swap(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                      in_stack_fffffffffffffb58);
  iVar1 = secp256k1_memcmp_var(local_258,auStackY_4b8,600);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xdf7,"test condition failed: secp256k1_memcmp_var(a, e, sizeof(a)) == 0");
    abort();
  }
  return;
}

Assistant:

static void test_heap_swap(void) {
    unsigned char a[600];
    unsigned char e[sizeof(a)];
    memset(a,       21, 200);
    memset(a + 200, 99, 200);
    memset(a + 400, 42, 200);
    memset(e,       42, 200);
    memset(e + 200, 99, 200);
    memset(e + 400, 21, 200);
    secp256k1_heap_swap(a, 0, 2, 200);
    CHECK(secp256k1_memcmp_var(a, e, sizeof(a)) == 0);
}